

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

int __thiscall
NaDynAr<NaPetriNode_*>::insert(NaDynAr<NaPetriNode_*> *this,int index,NaPetriNode **pobj)

{
  item *piVar1;
  item *piVar2;
  undefined4 *puVar3;
  
  if (pobj != (NaPetriNode **)0x0) {
    piVar1 = (item *)operator_new(0x10);
    piVar1->pData = pobj;
    piVar1->pNext = (item *)0x0;
    if (this->nItems == index) {
      this->pTail->pNext = piVar1;
      piVar1->pNext = (item *)0x0;
    }
    else {
      piVar2 = fetch_item(this,index);
      piVar1->pNext = piVar2;
      if (index == 0) {
        this->pHead = piVar1;
      }
      else {
        piVar2 = fetch_item(this,index + -1);
        piVar2->pNext = piVar1;
      }
    }
    this->nItems = this->nItems + 1;
    return index;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

virtual int   insert (int index, type* pobj) {
    if(NULL == pobj)
      throw(na_null_pointer);

    item  *p = new item(pobj);

#ifdef DynAr_DEBUG
    NaPrintLog("DynAr::insert(this=0x%08p), %d items, new item=0x%08p at %d\n",
	       this, nItems, p, index);
#endif /* DynAr_DEBUG */

    if(nItems == index){
      pTail->pNext = p;
      p->pNext = NULL;
    }
    else{
      item    *pNext = fetch_item(index);
      p->pNext = pNext;
      if(0 == index)
	pHead = p;
      else
	fetch_item(index - 1)->pNext = p;
    }
    ++nItems;

    return index;
  }